

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreParsingUtils.h
# Opt level: O2

string * Assimp::Ogre::Trim(string *s,bool newlines)

{
  pointer pcVar1;
  size_type sVar2;
  long lVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  lVar7 = 0;
  lVar3 = 0;
  for (lVar4 = (long)sVar2 >> 2; 0 < lVar4; lVar4 = lVar4 + -1) {
    if ((0x20 < (ulong)(byte)pcVar1[lVar7 * 4]) ||
       ((0x100003601U >> ((ulong)(byte)pcVar1[lVar7 * 4] & 0x3f) & 1) == 0)) {
      pbVar6 = (byte *)(pcVar1 + -lVar3);
      goto LAB_004656b1;
    }
    if ((0x20 < (ulong)(byte)pcVar1[lVar7 * 4 + 1]) ||
       ((0x100003601U >> ((ulong)(byte)pcVar1[lVar7 * 4 + 1] & 0x3f) & 1) == 0)) {
      pbVar6 = (byte *)(pcVar1 + (1 - lVar3));
      goto LAB_004656b1;
    }
    if ((0x20 < (ulong)(byte)pcVar1[lVar7 * 4 + 2]) ||
       ((0x100003601U >> ((ulong)(byte)pcVar1[lVar7 * 4 + 2] & 0x3f) & 1) == 0)) {
      pbVar6 = (byte *)(pcVar1 + (2 - lVar3));
      goto LAB_004656b1;
    }
    if ((0x20 < (ulong)(byte)pcVar1[lVar7 * 4 + 3]) ||
       ((0x100003601U >> ((ulong)(byte)pcVar1[lVar7 * 4 + 3] & 0x3f) & 1) == 0)) {
      pbVar6 = (byte *)(pcVar1 + (3 - lVar3));
      goto LAB_004656b1;
    }
    lVar3 = lVar3 + -4;
    lVar7 = lVar7 + 1;
  }
  pbVar5 = (byte *)(pcVar1 + -lVar3);
  lVar4 = sVar2 + lVar3;
  if (lVar4 == 1) {
LAB_0046566e:
    if ((0x20 < (ulong)*pbVar5) ||
       (pbVar6 = (byte *)(pcVar1 + sVar2), (0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) {
      pbVar6 = pbVar5;
    }
  }
  else if (lVar4 == 3) {
    pbVar6 = pbVar5;
    if (((ulong)(byte)pcVar1[lVar7 * 4] < 0x21) &&
       ((0x100003601U >> ((ulong)(byte)pcVar1[lVar7 * 4] & 0x3f) & 1) != 0)) {
      pbVar5 = (byte *)(pcVar1 + (1 - lVar3));
      goto LAB_0046565c;
    }
  }
  else {
    pbVar6 = (byte *)(pcVar1 + sVar2);
    if (lVar4 == 2) {
LAB_0046565c:
      pbVar6 = pbVar5;
      if (((ulong)*pbVar5 < 0x21) && ((0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0)) {
        pbVar5 = pbVar5 + 1;
        goto LAB_0046566e;
      }
    }
  }
LAB_004656b1:
  std::__cxx11::string::erase(s,pcVar1,pbVar6);
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  lVar7 = 0;
  lVar3 = 0;
  for (lVar4 = (long)sVar2 >> 2; 0 < lVar4; lVar4 = lVar4 + -1) {
    if ((0x20 < (ulong)(byte)pcVar1[lVar7 * 4]) ||
       ((0x100003601U >> ((ulong)(byte)pcVar1[lVar7 * 4] & 0x3f) & 1) == 0)) {
      pbVar6 = (byte *)(pcVar1 + -lVar3);
      goto LAB_004657d7;
    }
    if ((0x20 < (ulong)(byte)pcVar1[lVar7 * 4 + 1]) ||
       ((0x100003601U >> ((ulong)(byte)pcVar1[lVar7 * 4 + 1] & 0x3f) & 1) == 0)) {
      pbVar6 = (byte *)(pcVar1 + (1 - lVar3));
      goto LAB_004657d7;
    }
    if ((0x20 < (ulong)(byte)pcVar1[lVar7 * 4 + 2]) ||
       ((0x100003601U >> ((ulong)(byte)pcVar1[lVar7 * 4 + 2] & 0x3f) & 1) == 0)) {
      pbVar6 = (byte *)(pcVar1 + (2 - lVar3));
      goto LAB_004657d7;
    }
    if ((0x20 < (ulong)(byte)pcVar1[lVar7 * 4 + 3]) ||
       ((0x100003601U >> ((ulong)(byte)pcVar1[lVar7 * 4 + 3] & 0x3f) & 1) == 0)) {
      pbVar6 = (byte *)(pcVar1 + (3 - lVar3));
      goto LAB_004657d7;
    }
    lVar3 = lVar3 + -4;
    lVar7 = lVar7 + 1;
  }
  pbVar5 = (byte *)(pcVar1 + -lVar3);
  lVar4 = sVar2 + lVar3;
  if (lVar4 != 1) {
    if (lVar4 == 3) {
      pbVar6 = pbVar5;
      if ((0x20 < (ulong)(byte)pcVar1[lVar7 * 4]) ||
         ((0x100003601U >> ((ulong)(byte)pcVar1[lVar7 * 4] & 0x3f) & 1) == 0)) goto LAB_004657d7;
      pbVar5 = (byte *)(pcVar1 + (1 - lVar3));
    }
    else {
      pbVar6 = (byte *)(pcVar1 + sVar2);
      if (lVar4 != 2) goto LAB_004657d7;
    }
    pbVar6 = pbVar5;
    if ((0x20 < (ulong)*pbVar5) || ((0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
    goto LAB_004657d7;
    pbVar5 = pbVar5 + 1;
  }
  if ((0x20 < (ulong)*pbVar5) ||
     (pbVar6 = (byte *)(pcVar1 + sVar2), (0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) {
    pbVar6 = pbVar5;
  }
LAB_004657d7:
  std::__cxx11::string::erase(s,pcVar1,pbVar6);
  return s;
}

Assistant:

static AI_FORCE_INLINE
std::string &Trim(std::string &s, bool newlines = true) {
    return TrimLeft(TrimRight(s, newlines), newlines);
}